

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::XmlReporter::listTests
          (XmlReporter *this,
          vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests)

{
  TestCaseInfo *this_00;
  char *__s;
  StringRef text;
  size_t sVar1;
  XmlFormatting fmt;
  XmlWriter *this_01;
  pointer pTVar2;
  StringRef text_00;
  allocator<char> local_a9;
  StringRef local_a8;
  string local_88;
  pointer local_68;
  ScopedElement sourceTag;
  ScopedElement outerTag;
  ScopedElement innerTag;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"MatchingTests",(allocator<char> *)&local_a8);
  this_01 = &this->m_xml;
  XmlWriter::scopedElement((XmlWriter *)&outerTag,(string *)this_01,(XmlFormatting)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  local_68 = (tests->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  for (pTVar2 = (tests->
                super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
                _M_impl.super__Vector_impl_data._M_start; pTVar2 != local_68; pTVar2 = pTVar2 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"TestCase",(allocator<char> *)&local_a8);
    fmt = (XmlFormatting)&local_88;
    XmlWriter::scopedElement((XmlWriter *)&innerTag,(string *)this_01,fmt);
    std::__cxx11::string::~string((string *)&local_88);
    this_00 = pTVar2->m_info;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Name",(allocator<char> *)&local_a8);
    XmlWriter::startElement(this_01,&local_88,Indent);
    text.m_start = (this_00->name)._M_dataplus._M_p;
    text.m_size = (this_00->name)._M_string_length;
    XmlWriter::writeText(this_01,text,None);
    XmlWriter::endElement(this_01,Newline);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"ClassName",(allocator<char> *)&local_a8);
    XmlWriter::startElement(this_01,&local_88,Indent);
    XmlWriter::writeText(this_01,this_00->className,None);
    XmlWriter::endElement(this_01,Newline);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Tags",(allocator<char> *)&sourceTag);
    XmlWriter::startElement(this_01,&local_88,Indent);
    TestCaseInfo::tagsAsString_abi_cxx11_((string *)&local_a8,this_00);
    XmlWriter::writeText(this_01,local_a8,None);
    XmlWriter::endElement(this_01,Newline);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"SourceInfo",(allocator<char> *)&local_a8);
    XmlWriter::scopedElement((XmlWriter *)&sourceTag,(string *)this_01,fmt);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"File",(allocator<char> *)&local_a8);
    XmlWriter::startElement(this_01,&local_88,Indent);
    __s = (this_00->lineInfo).file;
    sVar1 = strlen(__s);
    text_00.m_size = sVar1;
    text_00.m_start = __s;
    XmlWriter::writeText(this_01,text_00,None);
    XmlWriter::endElement(this_01,Newline);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Line",&local_a9);
    XmlWriter::startElement(this_01,&local_88,Indent);
    std::__cxx11::to_string((string *)&local_a8,(this_00->lineInfo).line);
    XmlWriter::writeText(this_01,local_a8,None);
    XmlWriter::endElement(this_01,Newline);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    XmlWriter::ScopedElement::~ScopedElement(&sourceTag);
    XmlWriter::ScopedElement::~ScopedElement(&innerTag);
  }
  XmlWriter::ScopedElement::~ScopedElement(&outerTag);
  return;
}

Assistant:

void XmlReporter::listTests(std::vector<TestCaseHandle> const& tests) {
        auto outerTag = m_xml.scopedElement("MatchingTests");
        for (auto const& test : tests) {
            auto innerTag = m_xml.scopedElement("TestCase");
            auto const& testInfo = test.getTestCaseInfo();
            m_xml.startElement("Name", XmlFormatting::Indent)
                 .writeText(testInfo.name, XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);
            m_xml.startElement("ClassName", XmlFormatting::Indent)
                 .writeText(testInfo.className, XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);
            m_xml.startElement("Tags", XmlFormatting::Indent)
                 .writeText(testInfo.tagsAsString(), XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);

            auto sourceTag = m_xml.scopedElement("SourceInfo");
            m_xml.startElement("File", XmlFormatting::Indent)
                 .writeText(testInfo.lineInfo.file, XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);
            m_xml.startElement("Line", XmlFormatting::Indent)
                 .writeText(std::to_string(testInfo.lineInfo.line), XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);
        }
    }